

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildReg3
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,ProfileId profileId)

{
  StackSym *pSVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar2;
  bool bVar3;
  uint uVar4;
  RegSlot RVar5;
  BOOL BVar6;
  JITTimeFunctionBody *pJVar7;
  RegOpnd *pRVar8;
  IntConstOpnd *src1Opnd_00;
  IntConstOpnd *src2Opnd_00;
  Instr *this_00;
  Opnd *pOVar9;
  RegOpnd *this_01;
  RegOpnd *dstOpnd_00;
  JITTimeProfileInfo *this_02;
  JitArenaAllocator *pJVar10;
  Func *pFVar11;
  JitProfilingInstr *pJVar12;
  ProfiledInstr *pPVar13;
  bool bVar14;
  TrackAllocData local_98;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_70;
  LdElemInfo *newLdElemInfo;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paStack_60;
  ValueType arrayType;
  LdElemInfo *ldElemInfo;
  bool wasNotProfiled;
  bool isProfiledInstr;
  StackSym *dstSym;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  Instr *instr;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  if (newOpcode == NewInnerScopeSlots) {
    pJVar7 = Func::GetJITFunctionBody(this->m_func);
    uVar4 = JITTimeFunctionBody::GetInnerScopeCount(pJVar7);
    if (uVar4 <= dstRegSlot) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    pJVar7 = Func::GetJITFunctionBody(this->m_func);
    RVar5 = JITTimeFunctionBody::GetFirstInnerScopeReg(pJVar7);
    pRVar8 = BuildDstOpnd(this,RVar5 + dstRegSlot,TyVar,false,false);
    src1Opnd_00 = IR::IntConstOpnd::New((ulong)src1RegSlot,TyVar,this->m_func,false);
    src2Opnd_00 = IR::IntConstOpnd::New((ulong)src2RegSlot,TyVar,this->m_func,false);
    this_00 = IR::Instr::New(NewScopeSlotsWithoutPropIds,&pRVar8->super_Opnd,
                             &src1Opnd_00->super_Opnd,&src2Opnd_00->super_Opnd,this->m_func);
    pOVar9 = IR::Instr::GetDst(this_00);
    pRVar8 = IR::Opnd::AsRegOpnd(pOVar9);
    if ((*(uint *)&pRVar8->m_sym->field_0x18 & 1) != 0) {
      pOVar9 = IR::Instr::GetDst(this_00);
      pRVar8 = IR::Opnd::AsRegOpnd(pOVar9);
      *(uint *)&pRVar8->m_sym->field_0x18 = *(uint *)&pRVar8->m_sym->field_0x18 & 0xfffffffd | 2;
    }
    AddInstr(this,this_00,offset);
  }
  else {
    pRVar8 = BuildSrcOpnd(this,src1RegSlot,TyVar);
    this_01 = BuildSrcOpnd(this,src2RegSlot,TyVar);
    dstOpnd_00 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    pSVar1 = dstOpnd_00->m_sym;
    bVar14 = profileId != 0xffff;
    ldElemInfo._6_1_ = 0;
    paStack_60 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
    if ((bVar14) && (newOpcode == IsIn)) {
      bVar3 = DoLoadInstructionArrayProfileInfo(this);
      if (bVar3) {
        this_02 = Func::GetReadOnlyProfileInfo(this->m_func);
        paStack_60 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     JITTimeProfileInfo::GetLdElemInfo(this_02,profileId);
        newLdElemInfo._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             Js::LdElemInfo::GetArrayType((LdElemInfo *)&paStack_60->field_0);
        bVar3 = Js::LdElemInfo::WasProfiled((LdElemInfo *)&paStack_60->field_0);
        ldElemInfo._6_1_ = (bVar3 ^ 0xffU) & 1;
        bVar3 = ValueType::IsLikelyNativeArray((ValueType *)((long)&newLdElemInfo + 6));
        if ((bVar3) && (bVar3 = AllowNativeArrayProfileInfo(this), !bVar3)) {
          newLdElemInfo._4_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::SetArrayTypeId((ValueType *)((long)&newLdElemInfo + 6),TypeIds_Array);
          pJVar10 = this->m_func->m_alloc;
          newLdElemInfo._6_2_ = newLdElemInfo._4_2_;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_98,(type_info *)&Js::LdElemInfo::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x838);
          pJVar10 = (JitArenaAllocator *)
                    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)pJVar10,&local_98);
          local_70 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     new<Memory::JitArenaAllocator>(6,pJVar10,0x4e98c0);
          *(undefined4 *)local_70 = *(undefined4 *)paStack_60;
          local_70[2] = paStack_60[2];
          local_70->field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               newLdElemInfo._6_2_;
          paStack_60 = local_70;
        }
        IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)newLdElemInfo._6_2_);
        pFVar11 = Func::GetTopFunc(this->m_func);
        BVar6 = Func::HasTry(pFVar11);
        if (BVar6 != 0) {
          pFVar11 = Func::GetTopFunc(this->m_func);
          bVar3 = Func::DoOptimizeTry(pFVar11);
          if (!bVar3) {
            bVar14 = false;
          }
        }
      }
      else {
        bVar14 = false;
      }
    }
    if (bVar14) {
      bVar14 = Func::DoSimpleJitDynamicProfile(this->m_func);
      if (bVar14) {
        src1Opnd = (RegOpnd *)
                   IR::JitProfilingInstr::New
                             (newOpcode,&dstOpnd_00->super_Opnd,&pRVar8->super_Opnd,
                              &this_01->super_Opnd,this->m_func);
        pJVar12 = IR::Instr::AsJitProfilingInstr((Instr *)src1Opnd);
        pJVar12->profileId = profileId;
      }
      else {
        src1Opnd = (RegOpnd *)
                   IR::ProfiledInstr::New
                             (newOpcode,&dstOpnd_00->super_Opnd,&pRVar8->super_Opnd,
                              &this_01->super_Opnd,this->m_func);
        paVar2 = paStack_60;
        if (newOpcode == IsIn) {
          pPVar13 = IR::Instr::AsProfiledInstr((Instr *)src1Opnd);
          (pPVar13->u).ldElemInfo = (LdElemInfo *)paVar2;
        }
        else {
          pPVar13 = IR::Instr::AsProfiledInstr((Instr *)src1Opnd);
          *(uint *)&pPVar13->u = (uint)profileId;
        }
      }
    }
    else {
      src1Opnd = (RegOpnd *)
                 IR::Instr::New(newOpcode,&dstOpnd_00->super_Opnd,&pRVar8->super_Opnd,
                                &this_01->super_Opnd,this->m_func);
    }
    AddInstr(this,(Instr *)src1Opnd,offset);
    if ((ldElemInfo._6_1_ != 0) && (bVar14 = DoBailOnNoProfile(this), bVar14)) {
      InsertBailOnNoProfile(this,(Instr *)src1Opnd);
    }
    if (newOpcode == LdInnerFrameDisplay) {
      if ((*(uint *)&pSVar1->field_0x18 & 1) != 0) {
        *(uint *)&pSVar1->field_0x18 = *(uint *)&pSVar1->field_0x18 & 0xfffffffd | 2;
      }
    }
    else if (((newOpcode == LdHandlerScope) || (newOpcode == NewScopeSlotsWithoutPropIds)) &&
            ((*(uint *)&pSVar1->field_0x18 & 1) != 0)) {
      *(uint *)&pSVar1->field_0x18 = *(uint *)&pSVar1->field_0x18 & 0xfffffffd | 2;
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildReg3(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                        Js::RegSlot src2RegSlot, Js::ProfileId profileId)
{
    IR::Instr *     instr;

    if (newOpcode == Js::OpCode::NewInnerScopeSlots)
    {
        if (dstRegSlot >= m_func->GetJITFunctionBody()->GetInnerScopeCount())
        {
            Js::Throw::FatalInternalError();
        }
        newOpcode = Js::OpCode::NewScopeSlotsWithoutPropIds;
        dstRegSlot += m_func->GetJITFunctionBody()->GetFirstInnerScopeReg();
        instr = IR::Instr::New(newOpcode, BuildDstOpnd(dstRegSlot),
                               IR::IntConstOpnd::New(src1RegSlot, TyVar, m_func),
                               IR::IntConstOpnd::New(src2RegSlot, TyVar, m_func),
                               m_func);
        if (instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)
        {
            instr->GetDst()->AsRegOpnd()->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    IR::RegOpnd *   src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(dstRegSlot);
    StackSym *      dstSym = dstOpnd->m_sym;

    bool isProfiledInstr = (profileId != Js::Constants::NoProfileId);
    bool wasNotProfiled = false;
    const Js::LdElemInfo * ldElemInfo = nullptr;

    if (isProfiledInstr && newOpcode == Js::OpCode::IsIn)
    {
        if (!DoLoadInstructionArrayProfileInfo())
        {
            isProfiledInstr = false;
        }
        else
        {
            ldElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetLdElemInfo(profileId);
            ValueType arrayType = ldElemInfo->GetArrayType();
            wasNotProfiled = !ldElemInfo->WasProfiled();

            if (arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
            {
                arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);

                // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the ProfiledInstr.
                Js::LdElemInfo *const newLdElemInfo = JitAnew(m_func->m_alloc, Js::LdElemInfo, *ldElemInfo);
                newLdElemInfo->arrayType = arrayType;
                ldElemInfo = newLdElemInfo;
            }

            src2Opnd->SetValueType(arrayType);

            if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
            {
                isProfiledInstr = false;
            }
        }
    }

    if (isProfiledInstr)
    {
        if (m_func->DoSimpleJitDynamicProfile())
        {
            instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            instr->AsJitProfilingInstr()->profileId = profileId;
        }
        else
        {
            instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            if (newOpcode == Js::OpCode::IsIn)
            {
                instr->AsProfiledInstr()->u.ldElemInfo = ldElemInfo;
            }
            else
            {
                instr->AsProfiledInstr()->u.profileId = profileId;
            }
        }
    }
    else
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
    }

    this->AddInstr(instr, offset);

    if (wasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
    
    switch (newOpcode)
    {
    case Js::OpCode::LdHandlerScope:
    case Js::OpCode::NewScopeSlotsWithoutPropIds:
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        break;

    case Js::OpCode::LdInnerFrameDisplay:
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        break;
    }
}